

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IfElseProd * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSeqProductionSymbol::IfElseProd,slang::ast::Expression_const&,slang::ast::RandSeqProductionSymbol::ProdItem&,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
          (BumpAllocator *this,Expression *args,ProdItem *args_1,
          optional<slang::ast::RandSeqProductionSymbol::ProdItem> *args_2)

{
  ProdItem ifItem;
  optional<slang::ast::RandSeqProductionSymbol::ProdItem> elseItem;
  IfElseProd *pIVar1;
  void *in_RCX;
  __extent_storage<18446744073709551615UL> in_RSI;
  size_t in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  BumpAllocator *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff80;
  Expression *in_stack_ffffffffffffff98;
  IfElseProd *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 local_48;
  
  pIVar1 = (IfElseProd *)
           allocate(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  memcpy(&stack0xffffffffffffff98,in_RCX,0x28);
  ifItem.target = (RandSeqProductionSymbol *)local_48;
  ifItem._0_8_ = in_stack_ffffffffffffffb0;
  ifItem.args._M_ptr = (pointer)in_stack_ffffffffffffff80;
  ifItem.args._M_extent._M_extent_value = in_RSI._M_extent_value;
  elseItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload.
  _M_value.target = (RandSeqProductionSymbol *)in_stack_ffffffffffffff98;
  elseItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload.
  _0_8_ = pIVar1;
  elseItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload.
  _M_value.args._M_ptr = (pointer)in_stack_ffffffffffffffa0;
  elseItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload.
  _M_value.args._M_extent._M_extent_value =
       (__extent_storage<18446744073709551615UL>)
       (__extent_storage<18446744073709551615UL>)in_stack_ffffffffffffffa8;
  elseItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._32_8_ =
       in_stack_ffffffffffffffb0;
  ast::RandSeqProductionSymbol::IfElseProd::IfElseProd
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,ifItem,elseItem);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }